

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shuff.hpp
# Opt level: O3

void shuff_decompress(uint32_t *out_u32,size_t to_decode,uint8_t *in_u8,size_t cSrcSize)

{
  ulong *puVar1;
  uint64_t uVar2;
  uint64_t *A;
  ulong uVar3;
  uint64_t *puVar4;
  ulong uVar5;
  ulong *puVar6;
  uint64_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  ulong uVar12;
  ulong uVar13;
  uint64_t *puVar14;
  long lVar15;
  bool bVar16;
  uint64_t cw_lens [64];
  bit_io_t local_260;
  uint64_t local_238 [65];
  
  local_260.bytes_written = 0;
  A = (uint64_t *)shuff_allocate(0x40000000);
  uVar3 = *(ulong *)in_u8 >> 0x25;
  uVar13 = (ulong)((uint)(*(ulong *)in_u8 >> 0x25) * 8);
  puVar4 = (uint64_t *)shuff_allocate(uVar13 + 1);
  uVar5 = *(ulong *)in_u8 >> 0x1f & 0x3f;
  local_260.buff_btg = 0x1f;
  memset(local_238,0,(*(ulong *)in_u8 >> 0x1f & 0x3f) * 8 + 8);
  puVar14 = (uint64_t *)(uVar13 + (long)puVar4);
  if (uVar3 != 0) {
    local_260.buff_btg = 0x1f;
    uVar10 = uVar5 + 1;
    puVar7 = puVar4;
    do {
      do {
        uVar12 = local_260.buff_btg - 1;
        local_260.buff_btg = uVar12;
        uVar13 = *(ulong *)in_u8;
        if (uVar12 == 0) {
          in_u8 = (uint8_t *)((long)in_u8 + 8);
          local_260.buff_btg = 0x40;
        }
        uVar10 = uVar10 - 1;
      } while ((uVar13 >> (uVar12 & 0x3f) & 1) == 0);
      local_238[uVar10] = local_238[uVar10] + 1;
      *puVar7 = uVar10;
      puVar7 = puVar7 + 1;
      uVar10 = uVar5 + 1;
    } while (puVar7 < puVar14);
  }
  uVar13 = 0xffffffffffffffff;
  do {
    lVar15 = uVar13 + 1;
    uVar13 = uVar13 + 1;
  } while (local_238[lVar15] == 0);
  local_260.in_u64 = (uint64_t *)in_u8;
  shuff_build_canonical_arrays(local_238,uVar5);
  shuff_interp_decode(&local_260,A,uVar3);
  puVar7 = puVar14;
  if (uVar5 != 0) {
    uVar12 = 0;
    do {
      local_238[0] = local_238[0] + local_238[uVar12 + 1];
      local_238[uVar12 + 1] = local_238[0];
      uVar12 = uVar12 + 1;
    } while (uVar5 != uVar12);
  }
  while (puVar7 = puVar7 + -1, puVar4 <= puVar7) {
    uVar10 = *puVar7;
    uVar11 = local_238[uVar10 - 1];
    *puVar7 = uVar11;
    local_238[uVar10 - 1] = uVar11 + 1;
  }
  *puVar14 = 1;
  if (uVar3 != 0) {
    uVar10 = *puVar4;
    uVar12 = 0;
    do {
      if (-1 < (long)uVar10) {
        uVar11 = A[uVar12];
        uVar8 = uVar12;
        do {
          puVar14 = puVar4 + uVar8;
          uVar8 = (ulong)(int)uVar10;
          *puVar14 = 0xffffffffffffffff;
          uVar2 = A[uVar8];
          A[uVar8] = uVar11;
          uVar10 = puVar4[uVar8];
          uVar11 = uVar2;
        } while (-1 < (long)uVar10);
      }
      uVar12 = uVar12 - 1;
      do {
        uVar10 = puVar4[uVar12 + 1];
        uVar12 = uVar12 + 1;
      } while (uVar10 == 0xffffffffffffffff);
    } while (uVar12 < uVar3);
  }
  free(puVar4);
  shuff_build_lut(uVar5);
  if (to_decode != 0) {
    uVar3 = 0x40;
    uVar5 = 8;
    if (8 < uVar13) {
      uVar5 = uVar13;
    }
    uVar12 = 0;
    puVar6 = local_260.in_u64;
    uVar13 = local_260.buff_btg;
    do {
      if (uVar3 == 0) {
        uVar8 = 0;
      }
      else {
        uVar8 = (*puVar6 << ((ulong)(byte)-(char)uVar13 & 0x3f)) >>
                ((ulong)(byte)-(char)uVar3 & 0x3f);
        uVar9 = uVar13 - uVar3;
        if (uVar13 < uVar3 || uVar9 == 0) {
          lVar15 = uVar3 - uVar13;
          puVar6 = puVar6 + 1;
          if (lVar15 < 1) {
            uVar13 = 0x40;
            goto LAB_001206d1;
          }
          uVar9 = 0x40 - lVar15;
          uVar8 = uVar8 | *puVar6 >> (-lVar15 & 0x3fU);
        }
        bVar16 = uVar9 == 0;
        if (bVar16) {
          uVar9 = 0x40;
        }
        puVar6 = puVar6 + bVar16;
        uVar13 = uVar9;
      }
LAB_001206d1:
      uVar8 = uVar8 | uVar12;
      puVar4 = shuff_lut[uVar8 >> 0x38];
      puVar14 = (uint64_t *)(uVar5 * 8 + 0x14b6c0);
      if (puVar4 == (uint64_t *)0x0) {
        do {
          puVar4 = puVar14 + 1;
          puVar1 = puVar14 + 1;
          puVar14 = puVar4;
        } while (uVar8 < *puVar1);
      }
      uVar3 = ((long)(puVar4 + -0x296da) >> 3) + 1;
      *out_u32 = (int)A[((uVar8 >> ((ulong)(byte)~(byte)((long)(puVar4 + -0x296da) >> 3) & 0x3f)) -
                        puVar4[-0x40]) + puVar4[0x40]] - 1;
      out_u32 = out_u32 + 1;
      uVar12 = uVar8 << (uVar3 & 0x3f);
      to_decode = to_decode - 1;
    } while (to_decode != 0);
  }
  free(A);
  return;
}

Assistant:

void shuff_decompress(
    uint32_t* out_u32, size_t to_decode, const uint8_t* in_u8, size_t cSrcSize)
{
    bit_io_t bio;
    SHUFF_START_INPUT(&bio, in_u8);
    uint64_t* mapping
        = (uint64_t*)shuff_allocate(sizeof(uint64_t) * SHUFF_MAX_SYMBOL);
    uint64_t cw_lens[SHUFF_L + 1];

    uint64_t n = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_MAX_SYMBOL);
    int64_t* lens = (int64_t*)shuff_allocate(sizeof(int64_t) * n + 1);

    uint64_t max_cw_len = SHUFF_INPUT_ULONG(&bio, SHUFF_LOG2_L);

    for (int i = 0; i <= (int)max_cw_len; i++)
        cw_lens[i] = 0;
    for (int64_t* p = lens; p < lens + n; p++) {
        *p = max_cw_len - SHUFF_INPUT_UNARY_CODE(&bio);
        cw_lens[*p]++;
    }

    uint64_t min_cw_len = 0;
    for (min_cw_len = 0; cw_lens[min_cw_len] == 0; min_cw_len++)
        ;

    shuff_build_canonical_arrays(cw_lens, max_cw_len);

    shuff_interp_decode(&bio, mapping, n);

    for (int i = 1; i <= (int64_t)max_cw_len; i++)
        cw_lens[i] += cw_lens[i - 1];

    for (int64_t* p = lens + n - 1; p >= lens; p--)
        *p = cw_lens[*p - 1]++;

    uint64_t t, from, S;
    int64_t start = 0;
    lens[n] = 1; // sentinel
    while (start < n) {
        from = start;
        S = mapping[start];

        while (lens[from] >= 0) {
            int i = lens[from];
            lens[from] = -1;
            t = mapping[i];
            mapping[i] = S;
            S = t;
            from = i;
        }

        while (lens[start] == -1)
            start++; // find next start (if any)
    }
    free(lens);

    shuff_build_lut(max_cw_len);

    uint64_t code = 0;
    uint64_t bits_needed = sizeof(uint64_t) << 3;
    uint64_t currcode;
    uint64_t currlen = sizeof(uint64_t) << 3;
    uint64_t* lj;
    uint64_t* start_linear_search
        = shuff_lj_base + SHUFF_MAX(SHUFF_LUT_BITS, min_cw_len) - 1;

    while (to_decode != 0) {
        code |= SHUFF_INPUT_ULONG(&bio, bits_needed);

        lj = shuff_lut[code >> ((sizeof(uint64_t) << 3) - SHUFF_LUT_BITS)];
        if (lj == NULL)
            for (lj = start_linear_search; code < *lj; lj++)
                ;
        currlen = lj - shuff_lj_base + 1;

        // calculate symbol number
        currcode = code >> ((sizeof(uint64_t) << 3) - currlen);
        currcode -= shuff_min_code[currlen - 1];
        currcode += shuff_offset[currlen - 1];

        // subtract the one added in encoding
        *out_u32++ = mapping[currcode] - 1; // we add 1 to everything we encode

        code <<= currlen;
        bits_needed = currlen;
        to_decode--;
    }

    free(mapping);
}